

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

void prepdelem(rnndb *db,rnndelem *elem,char *prefix,rnnvarinfo *parvi,int width)

{
  long lVar1;
  int iVar2;
  rnnbitset **pprVar3;
  rnndelem *prVar4;
  char **ppcVar5;
  char *in_RCX;
  rnndelem *in_RDX;
  rnndb *in_RSI;
  char *in_RDI;
  int in_R8D;
  rnndb *unaff_retaddr;
  int i;
  rnngroup *gr;
  int i_1;
  char *in_stack_ffffffffffffff90;
  char *file;
  rnnbitset *in_stack_ffffffffffffff98;
  rnndelem *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  rnndb *in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd8;
  char *pcVar6;
  
  if ((in_RSI->copyright).firstyear == 3) {
    in_stack_ffffffffffffffd0 = (rnndb *)0x0;
    for (in_stack_ffffffffffffffd8 = 0; in_stack_ffffffffffffffd8 < *(int *)(in_RDI + 0x58);
        in_stack_ffffffffffffffd8 = in_stack_ffffffffffffffd8 + 1) {
      iVar2 = strcmp((char *)**(undefined8 **)
                               (*(long *)(in_RDI + 0x50) + (long)in_stack_ffffffffffffffd8 * 8),
                     (in_RSI->copyright).license);
      if (iVar2 == 0) {
        in_stack_ffffffffffffffd0 =
             *(rnndb **)(*(long *)(in_RDI + 0x50) + (long)in_stack_ffffffffffffffd8 * 8);
        break;
      }
    }
    if (in_stack_ffffffffffffffd0 == (rnndb *)0x0) {
      fprintf(_stderr,"group %s not found!\n",(in_RSI->copyright).license);
      in_RDI[0x80] = '\x01';
      in_RDI[0x81] = '\0';
      in_RDI[0x82] = '\0';
      in_RDI[0x83] = '\0';
    }
    else {
      for (in_stack_ffffffffffffffd8 = 0;
          in_stack_ffffffffffffffd8 < *(int *)&(in_stack_ffffffffffffffd0->copyright).authors;
          in_stack_ffffffffffffffd8 = in_stack_ffffffffffffffd8 + 1) {
        if (in_RSI->bitsetsmax <= in_RSI->bitsetsnum) {
          if (in_RSI->bitsetsmax == 0) {
            in_RSI->bitsetsmax = 0x10;
          }
          else {
            in_RSI->bitsetsmax = in_RSI->bitsetsmax << 1;
          }
          pprVar3 = (rnnbitset **)realloc(in_RSI->bitsets,(long)in_RSI->bitsetsmax << 3);
          in_RSI->bitsets = pprVar3;
        }
        prVar4 = copydelem(in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
        iVar2 = in_RSI->bitsetsnum;
        in_RSI->bitsetsnum = iVar2 + 1;
        in_RSI->bitsets[iVar2] = (rnnbitset *)prVar4;
      }
    }
    (in_RSI->copyright).firstyear = 2;
    in_RSI->enums = (rnnenum **)0x1;
    (in_RSI->copyright).license = (char *)0x0;
  }
  if ((in_RSI->copyright).license != (char *)0x0) {
    ppcVar5 = (char **)catstr((char *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    in_RSI[1].files = ppcVar5;
  }
  prVar4 = in_RDX;
  if (in_RSI[1].files != (char **)0x0) {
    prVar4 = (rnndelem *)in_RSI[1].files;
  }
  file = in_RDI;
  prepvarinfo(unaff_retaddr,in_RDI,(rnnvarinfo *)in_RSI,(rnnvarinfo *)in_RDX);
  if (in_RSI->groupsnum == 0) {
    if (((rnnenum *)in_RSI->enums != (rnnenum *)0x1) && (*(char **)&in_RSI->enumsnum == (char *)0x0)
       ) {
      if ((in_RSI->copyright).firstyear == 0) {
        *(char **)&in_RSI->enumsnum = (char *)(long)(*(int *)&(in_RSI->copyright).authors / in_R8D);
      }
      else {
        fprintf(_stderr,"%s has non-1 length, but no stride!\n",in_RSI[1].files);
        file[0x80] = '\x01';
        file[0x81] = '\0';
        file[0x82] = '\0';
        file[0x83] = '\0';
      }
    }
    preptypeinfo(in_stack_ffffffffffffffd0,
                 (rnntypeinfo *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),in_RDI
                 ,(rnnvarinfo *)prVar4,(int)((ulong)&in_RSI->estatus >> 0x20),file);
    for (iVar2 = 0; iVar2 < in_RSI->bitsetsnum; iVar2 = iVar2 + 1) {
      in_stack_ffffffffffffff98 = in_RSI->bitsets[iVar2];
      pcVar6 = file;
      prepdelem(in_RSI,in_RDX,in_RCX,(rnnvarinfo *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),
                (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
      in_stack_ffffffffffffff90 = file;
      file = pcVar6;
    }
    lVar1._0_4_ = in_RSI->spectypesnum;
    lVar1._4_4_ = in_RSI->spectypesmax;
    if ((lVar1 != 0) && ((in_RSI->copyright).license != (char *)0x0)) {
      ppcVar5 = (char **)catstr((char *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      in_RSI[1].files = ppcVar5;
    }
  }
  return;
}

Assistant:

static void prepdelem(struct rnndb *db, struct rnndelem *elem, char *prefix, struct rnnvarinfo *parvi, int width) {
	if (elem->type == RNN_ETYPE_USE_GROUP) {
		int i;
		struct rnngroup *gr = 0;
		for (i = 0; i < db->groupsnum; i++)
			if (!strcmp(db->groups[i]->name, elem->name)) {
				gr = db->groups[i];
				break;
			}
		if (gr) {
			for (i = 0; i < gr->subelemsnum; i++)
				ADDARRAY(elem->subelems, copydelem(gr->subelems[i], elem->file));
		} else {
			fprintf (stderr, "group %s not found!\n", elem->name);
			db->estatus = 1;
		}
		elem->type = RNN_ETYPE_STRIPE;
		elem->length = 1;
		elem->name = 0;
	}
	if (elem->name)
		elem->fullname = catstr(prefix, elem->name);
	prepvarinfo (db, elem->fullname?elem->fullname:prefix, &elem->varinfo, parvi);
	if (elem->varinfo.dead)
		return;
	if (elem->length != 1 && !elem->stride) {
		if (elem->type != RNN_ETYPE_REG) {
			fprintf (stderr, "%s has non-1 length, but no stride!\n", elem->fullname);
			db->estatus = 1;
		} else {
			elem->stride = elem->width/width;
		}
	}
	preptypeinfo(db, &elem->typeinfo, elem->name?elem->fullname:prefix, &elem->varinfo, elem->width, elem->file);

	int i;
	for (i = 0; i < elem->subelemsnum; i++)
		prepdelem(db,  elem->subelems[i], elem->name?elem->fullname:prefix, &elem->varinfo, width);
	if (elem->varinfo.prefix && elem->name)
		elem->fullname = catstr(elem->varinfo.prefix, elem->fullname);
}